

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderRead(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlParserCtxtPtr pxVar2;
  xmlNodePtr pxVar3;
  xmlNodePtr *ppxVar4;
  xmlChar *str;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlNodePtr pxVar9;
  xmlXIncludeCtxtPtr ctxt;
  uint uVar10;
  _xmlNode *p_Var11;
  _xmlNode *p_Var12;
  xmlTextReaderState xVar13;
  xmlNodePtr cur;
  long lVar14;
  xmlNodePtr tmp;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  reader->curnode = (xmlNodePtr)0x0;
  if (reader->doc != (xmlDocPtr)0x0) {
    xVar13 = reader->state;
    if (xVar13 == XML_TEXTREADER_END) {
      return 0;
    }
    p_Var11 = reader->node;
    do {
      if (p_Var11 == (_xmlNode *)0x0) {
        p_Var12 = reader->doc->children;
        if (p_Var12 == (_xmlNode *)0x0) goto LAB_001a0029;
LAB_0019ffad:
        reader->node = p_Var12;
LAB_0019ffb1:
        xVar13 = XML_TEXTREADER_START;
        p_Var11 = p_Var12;
      }
      else if ((xVar13 == XML_TEXTREADER_BACKTRACK) ||
              ((xVar1 = p_Var11->type, xVar1 < XML_XINCLUDE_END &&
               ((0x84020U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
LAB_0019ff72:
        p_Var12 = p_Var11->next;
        if (p_Var12 != (_xmlNode *)0x0) goto LAB_0019ffad;
        p_Var12 = p_Var11->parent;
        if (p_Var12 == (_xmlNode *)0x0) {
          xVar13 = XML_TEXTREADER_END;
        }
        else {
          if ((p_Var12->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) {
LAB_001a0029:
            reader->state = XML_TEXTREADER_END;
            return 0;
          }
          reader->node = p_Var12;
          reader->depth = reader->depth + -1;
          xVar13 = XML_TEXTREADER_BACKTRACK;
          p_Var11 = p_Var12;
        }
      }
      else {
        p_Var12 = p_Var11->children;
        if (p_Var12 != (_xmlNode *)0x0) {
          reader->node = p_Var12;
          reader->depth = reader->depth + 1;
          goto LAB_0019ffb1;
        }
        xVar13 = XML_TEXTREADER_BACKTRACK;
        if (xVar1 != XML_ATTRIBUTE_NODE) goto LAB_0019ff72;
      }
      reader->state = xVar13;
      if (1 < p_Var11->type - XML_XINCLUDE_START) {
        return 1;
      }
    } while( true );
  }
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  if (reader->mode != 0) {
    xVar13 = reader->state;
    iVar8 = reader->ctxt->nodeNr;
    pxVar9 = reader->node;
    cur = pxVar9;
    goto LAB_001a00db;
  }
  reader->mode = 1;
  do {
    iVar8 = xmlTextReaderPushData(reader);
    if (iVar8 < 0) goto LAB_001a008c;
    pxVar2 = reader->ctxt;
    if (pxVar2->node != (xmlNodePtr)0x0) {
      if (pxVar2->myDoc == (xmlDocPtr)0x0) {
        p_Var11 = reader->node;
      }
      else {
        p_Var11 = pxVar2->myDoc->children;
        reader->node = p_Var11;
      }
      if (p_Var11 == (_xmlNode *)0x0) {
        reader->node = *pxVar2->nodeTab;
      }
      goto LAB_001a00b2;
    }
  } while ((reader->mode != 3) && (reader->state != XML_TEXTREADER_DONE));
  if (pxVar2->myDoc == (xmlDocPtr)0x0) {
    p_Var11 = reader->node;
  }
  else {
    p_Var11 = pxVar2->myDoc->children;
    reader->node = p_Var11;
  }
  if (p_Var11 == (_xmlNode *)0x0) {
LAB_001a008c:
    reader->mode = 2;
    reader->state = XML_TEXTREADER_ERROR;
    return -1;
  }
LAB_001a00b2:
  reader->state = XML_TEXTREADER_ELEMENT;
  reader->depth = 0;
  pxVar2->parseMode = XML_PARSE_READER;
  xVar13 = XML_TEXTREADER_START;
  cur = (xmlNodePtr)0x0;
  iVar8 = 0;
  while( true ) {
    pxVar9 = reader->node;
    if ((((pxVar9 != (xmlNodePtr)0x0) && (pxVar9->next == (_xmlNode *)0x0)) &&
        (pxVar9->type - XML_TEXT_NODE < 2)) &&
       (pxVar9 = xmlTextReaderExpand(reader), pxVar9 == (xmlNodePtr)0x0)) {
      return -1;
    }
    if ((reader->xinclude != 0) && (reader->in_xinclude == 0)) break;
LAB_001a0457:
    pxVar9 = reader->node;
    if (pxVar9 == (xmlNodePtr)0x0) goto LAB_001a0583;
    xVar1 = pxVar9->type;
    if (xVar1 == XML_ENTITY_REF_NODE) {
      if (reader->ctxt != (xmlParserCtxtPtr)0x0) {
        if (reader->ctxt->replaceEntities == 1) {
          p_Var11 = pxVar9->children;
          if (((p_Var11 != (_xmlNode *)0x0) && (p_Var11->type == XML_ENTITY_DECL)) &&
             (p_Var11->children != (_xmlNode *)0x0)) {
            xmlTextReaderEntPush(reader,pxVar9);
            pxVar9 = reader->node->children->children;
            reader->node = pxVar9;
LAB_001a04e3:
            if (pxVar9 == (xmlNodePtr)0x0) goto LAB_001a0583;
          }
        }
        else if ((reader->ctxt != (xmlParserCtxtPtr)0x0) &&
                (reader->validate != XML_TEXTREADER_NOT_VALIDATE)) {
          xmlTextReaderValidateEntity(reader);
          pxVar9 = reader->node;
          goto LAB_001a04e3;
        }
      }
LAB_001a04ec:
      if (((pxVar9->type != XML_ENTITY_DECL) || (reader->ent == (xmlNodePtr)0x0)) ||
         (reader->ent->children != pxVar9)) {
        if (reader->validate != XML_TEXTREADER_NOT_VALIDATE) {
          if (pxVar9->type == XML_ELEMENT_NODE) {
            if ((reader->state != XML_TEXTREADER_END) && (reader->state != XML_TEXTREADER_BACKTRACK)
               ) {
              xmlTextReaderValidatePush(reader);
            }
          }
          else if (pxVar9->type - XML_TEXT_NODE < 2) {
            str = pxVar9->content;
            iVar8 = xmlStrlen(str);
            xmlTextReaderValidateCData(reader,str,iVar8);
          }
        }
        goto LAB_001a0583;
      }
      iVar6 = reader->entNr;
      pxVar9 = (xmlNodePtr)0x0;
      if (0 < (long)iVar6) {
        uVar10 = iVar6 - 1;
        reader->entNr = uVar10;
        pxVar9 = (xmlNodePtr)0x0;
        ppxVar4 = reader->entTab;
        if (iVar6 != 1) {
          pxVar9 = ppxVar4[(long)iVar6 + -2];
        }
        reader->ent = pxVar9;
        pxVar9 = ppxVar4[uVar10];
        ppxVar4[uVar10] = (xmlNodePtr)0x0;
      }
      reader->node = pxVar9;
      reader->depth = reader->depth + 1;
LAB_001a00db:
      if (pxVar9 == (xmlNodePtr)0x0) {
        return -(uint)(reader->mode != 3);
      }
    }
    else {
      iVar6 = 1;
      if (xVar1 != XML_XINCLUDE_START) {
        if (xVar1 != XML_XINCLUDE_END) goto LAB_001a04ec;
        iVar6 = -1;
      }
      reader->in_xinclude = reader->in_xinclude + iVar6;
    }
    while (pxVar9->next == (_xmlNode *)0x0) {
      pxVar2 = reader->ctxt;
      if (pxVar2->nodeNr != iVar8) {
LAB_001a018c:
        if (xVar13 != XML_TEXTREADER_BACKTRACK) goto LAB_001a01a2;
        goto LAB_001a02d3;
      }
      if ((((xVar13 != XML_TEXTREADER_BACKTRACK) &&
           (p_Var11 = pxVar9->children, p_Var11 != (_xmlNode *)0x0)) &&
          ((xVar1 = pxVar9->type, xVar1 != XML_ENTITY_REF_NODE &&
           ((p_Var11->type != XML_TEXT_NODE || (p_Var11->next != (_xmlNode *)0x0)))))) &&
         ((XML_DTD_NODE < xVar1 ||
          ((0x6200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0))))
      goto LAB_001a01ad;
      pxVar3 = pxVar2->node;
      if ((((pxVar3 != (xmlNodePtr)0x0) && (pxVar3 != pxVar9)) && (pxVar3 != pxVar9->parent)) ||
         (pxVar2->instate == XML_PARSER_EOF)) goto LAB_001a018c;
      iVar6 = xmlTextReaderPushData(reader);
      if (iVar6 < 0) goto LAB_001a008c;
      pxVar9 = reader->node;
      if (pxVar9 == (xmlNodePtr)0x0) goto LAB_001a0172;
    }
    if (xVar13 == XML_TEXTREADER_BACKTRACK) {
LAB_001a01f8:
      if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (pxVar9->type == XML_ELEMENT_NODE)) {
        xmlTextReaderValidatePop(reader);
        pxVar9 = reader->node;
      }
      iVar6 = reader->preserves;
      if (0 < iVar6) {
        if ((pxVar9->extra & 4) == 0) {
          reader->node = pxVar9->next;
          goto LAB_001a0364;
        }
        iVar6 = iVar6 + -1;
        reader->preserves = iVar6;
      }
      p_Var11 = pxVar9->next;
      reader->node = p_Var11;
      reader->state = XML_TEXTREADER_ELEMENT;
      if (((iVar6 == 0) && (reader->in_xinclude == 0)) &&
         ((reader->entNr == 0 &&
          (((pxVar9 = p_Var11->prev, pxVar9 != (xmlNodePtr)0x0 && (pxVar9->type != XML_DTD_NODE)) &&
           ((pxVar9->extra & 2) == 0)))))) {
        if (cur == pxVar9) {
          cur = (xmlNodePtr)0x0;
        }
        xmlUnlinkNode(pxVar9);
        xmlTextReaderFreeNode(reader,pxVar9);
      }
    }
    else {
LAB_001a01a2:
      p_Var11 = pxVar9->children;
      bVar5 = false;
      if (p_Var11 == (_xmlNode *)0x0) {
LAB_001a01cb:
        if (pxVar9->next == (_xmlNode *)0x0) {
          if (((xVar13 == XML_TEXTREADER_ELEMENT) && (pxVar9->type == XML_ELEMENT_NODE && !bVar5))
             && ((pxVar9->extra & 1) == 0)) goto LAB_001a02c1;
LAB_001a02d3:
          if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
             (pxVar9->type == XML_ELEMENT_NODE)) {
            xmlTextReaderValidatePop(reader);
            pxVar9 = reader->node;
          }
          iVar6 = reader->preserves;
          iVar7 = iVar6;
          if ((0 < iVar6) && (iVar7 = 1, (pxVar9->extra & 4) != 0)) {
            iVar7 = iVar6 + -1;
            reader->preserves = iVar7;
          }
          p_Var11 = pxVar9->parent;
          reader->node = p_Var11;
          if ((p_Var11 == (_xmlNode *)0x0) ||
             ((p_Var11->type < (XML_XINCLUDE_END|XML_ATTRIBUTE_NODE) &&
              ((0x202200U >> (p_Var11->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
            if (reader->mode != 3) {
              iVar8 = xmlParseChunk(reader->ctxt,"",0,1);
              reader->state = XML_TEXTREADER_DONE;
              if (iVar8 != 0) {
                return -1;
              }
            }
            reader->node = (xmlNodePtr)0x0;
            reader->depth = -1;
            if ((((cur != (xmlNodePtr)0x0) && (reader->preserves == 0)) &&
                (reader->in_xinclude == 0)) &&
               (((reader->entNr == 0 && (cur->type != XML_DTD_NODE)) && ((cur->extra & 2) == 0)))) {
              xmlUnlinkNode(cur);
              xmlTextReaderFreeNode(reader,cur);
            }
LAB_001a0172:
            reader->state = XML_TEXTREADER_DONE;
            return 0;
          }
          if (((iVar7 == 0) && (reader->in_xinclude == 0)) &&
             ((reader->entNr == 0 &&
              ((pxVar9 = p_Var11->last, pxVar9 != (xmlNodePtr)0x0 && ((pxVar9->extra & 2) == 0))))))
          {
            xmlUnlinkNode(pxVar9);
            xmlTextReaderFreeNode(reader,pxVar9);
          }
          reader->depth = reader->depth + -1;
          reader->state = XML_TEXTREADER_BACKTRACK;
        }
        else {
          if ((((xVar13 != XML_TEXTREADER_ELEMENT) || (pxVar9->type != XML_ELEMENT_NODE || bVar5))
              || ((pxVar9->extra & 1) != 0)) || (0 < reader->in_xinclude)) goto LAB_001a01f8;
LAB_001a02c1:
          reader->state = XML_TEXTREADER_END;
          xVar13 = XML_TEXTREADER_ELEMENT;
        }
      }
      else {
LAB_001a01ad:
        if ((pxVar9->type < XML_XINCLUDE_END) &&
           (bVar5 = true,
           (0x84020U >> (pxVar9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0))
        goto LAB_001a01cb;
        reader->node = p_Var11;
        reader->depth = reader->depth + 1;
LAB_001a0364:
        reader->state = XML_TEXTREADER_ELEMENT;
      }
    }
  }
  pxVar9 = reader->node;
  if (pxVar9 != (xmlNodePtr)0x0) {
    if (((pxVar9->type == XML_ELEMENT_NODE) && (pxVar9->ns != (xmlNs *)0x0)) &&
       ((iVar6 = xmlStrEqual(pxVar9->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar6 != 0 ||
        (iVar6 = xmlStrEqual(reader->node->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar6 != 0)))) {
      if (reader->xincctxt == (xmlXIncludeCtxtPtr)0x0) {
        ctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
        reader->xincctxt = ctxt;
        xmlXIncludeSetFlags(ctxt,reader->parserFlags & 0xffff7fff);
      }
      pxVar9 = xmlTextReaderExpand(reader);
      if (pxVar9 == (xmlNodePtr)0x0) {
        return -1;
      }
      xmlXIncludeProcessNode(reader->xincctxt,reader->node);
    }
    goto LAB_001a0457;
  }
LAB_001a0583:
  if (((0 < reader->patternNr) && (reader->state != XML_TEXTREADER_END)) &&
     (reader->state != XML_TEXTREADER_BACKTRACK)) {
    lVar14 = 0;
    do {
      iVar8 = xmlPatternMatch(reader->patternTab[lVar14],reader->node);
      if (iVar8 == 1) {
        xmlTextReaderPreserve(reader);
        break;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < reader->patternNr);
  }
  if (((reader->validate == XML_TEXTREADER_VALIDATE_XSD) && (reader->xsdValidErrors == 0)) &&
     (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0)) {
    iVar8 = xmlSchemaIsValid(reader->xsdValidCtxt);
    reader->xsdValidErrors = (uint)(iVar8 == 0);
  }
  return 1;
}

Assistant:

int
xmlTextReaderRead(xmlTextReaderPtr reader) {
    int val, olddepth = 0;
    xmlTextReaderState oldstate = XML_TEXTREADER_START;
    xmlNodePtr oldnode = NULL;


    if (reader == NULL)
	return(-1);
    reader->curnode = NULL;
    if (reader->doc != NULL)
        return(xmlTextReaderReadTree(reader));
    if (reader->ctxt == NULL)
	return(-1);

#ifdef DEBUG_READER
    fprintf(stderr, "\nREAD ");
    DUMP_READER
#endif
    if (reader->mode == XML_TEXTREADER_MODE_INITIAL) {
	reader->mode = XML_TEXTREADER_MODE_INTERACTIVE;
	/*
	 * Initial state
	 */
	do {
	    val = xmlTextReaderPushData(reader);
		if (val < 0){
			reader->mode = XML_TEXTREADER_MODE_ERROR;
			reader->state = XML_TEXTREADER_ERROR;
		return(-1);
		}
	} while ((reader->ctxt->node == NULL) &&
		 ((reader->mode != XML_TEXTREADER_MODE_EOF) &&
		  (reader->state != XML_TEXTREADER_DONE)));
	if (reader->ctxt->node == NULL) {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL){
			reader->mode = XML_TEXTREADER_MODE_ERROR;
			reader->state = XML_TEXTREADER_ERROR;
		return(-1);
		}
	    reader->state = XML_TEXTREADER_ELEMENT;
	} else {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL)
		reader->node = reader->ctxt->nodeTab[0];
	    reader->state = XML_TEXTREADER_ELEMENT;
	}
	reader->depth = 0;
	reader->ctxt->parseMode = XML_PARSE_READER;
	goto node_found;
    }
    oldstate = reader->state;
    olddepth = reader->ctxt->nodeNr;
    oldnode = reader->node;

get_next_node:
    if (reader->node == NULL) {
	if (reader->mode == XML_TEXTREADER_MODE_EOF)
	    return(0);
	else
	    return(-1);
    }

    /*
     * If we are not backtracking on ancestors or examined nodes,
     * that the parser didn't finished or that we aren't at the end
     * of stream, continue processing.
     */
    while ((reader->node != NULL) && (reader->node->next == NULL) &&
	   (reader->ctxt->nodeNr == olddepth) &&
           ((oldstate == XML_TEXTREADER_BACKTRACK) ||
            (reader->node->children == NULL) ||
	    (reader->node->type == XML_ENTITY_REF_NODE) ||
	    ((reader->node->children != NULL) &&
	     (reader->node->children->type == XML_TEXT_NODE) &&
	     (reader->node->children->next == NULL)) ||
	    (reader->node->type == XML_DTD_NODE) ||
	    (reader->node->type == XML_DOCUMENT_NODE) ||
	    (reader->node->type == XML_HTML_DOCUMENT_NODE)) &&
	   ((reader->ctxt->node == NULL) ||
	    (reader->ctxt->node == reader->node) ||
	    (reader->ctxt->node == reader->node->parent)) &&
	   (reader->ctxt->instate != XML_PARSER_EOF)) {
	val = xmlTextReaderPushData(reader);
	if (val < 0){
		reader->mode = XML_TEXTREADER_MODE_ERROR;
		reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
	}
	if (reader->node == NULL)
	    goto node_end;
    }
    if (oldstate != XML_TEXTREADER_BACKTRACK) {
	if ((reader->node->children != NULL) &&
	    (reader->node->type != XML_ENTITY_REF_NODE) &&
	    (reader->node->type != XML_XINCLUDE_START) &&
	    (reader->node->type != XML_DTD_NODE)) {
	    reader->node = reader->node->children;
	    reader->depth++;
	    reader->state = XML_TEXTREADER_ELEMENT;
	    goto node_found;
	}
    }
    if (reader->node->next != NULL) {
	if ((oldstate == XML_TEXTREADER_ELEMENT) &&
            (reader->node->type == XML_ELEMENT_NODE) &&
	    (reader->node->children == NULL) &&
	    ((reader->node->extra & NODE_IS_EMPTY) == 0)
#ifdef LIBXML_XINCLUDE_ENABLED
	    && (reader->in_xinclude <= 0)
#endif
	    ) {
	    reader->state = XML_TEXTREADER_END;
	    goto node_found;
	}
#ifdef LIBXML_REGEXP_ENABLED
	if ((reader->validate) &&
	    (reader->node->type == XML_ELEMENT_NODE))
	    xmlTextReaderValidatePop(reader);
#endif /* LIBXML_REGEXP_ENABLED */
        if ((reader->preserves > 0) &&
	    (reader->node->extra & NODE_IS_SPRESERVED))
	    reader->preserves--;
	reader->node = reader->node->next;
	reader->state = XML_TEXTREADER_ELEMENT;

	/*
	 * Cleanup of the old node
	 */
	if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (reader->node->prev != NULL) &&
            (reader->node->prev->type != XML_DTD_NODE)) {
	    xmlNodePtr tmp = reader->node->prev;
	    if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
                if (oldnode == tmp)
                    oldnode = NULL;
		xmlUnlinkNode(tmp);
		xmlTextReaderFreeNode(reader, tmp);
	    }
	}

	goto node_found;
    }
    if ((oldstate == XML_TEXTREADER_ELEMENT) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->children == NULL) &&
	((reader->node->extra & NODE_IS_EMPTY) == 0)) {;
	reader->state = XML_TEXTREADER_END;
	goto node_found;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (reader->node->type == XML_ELEMENT_NODE))
	xmlTextReaderValidatePop(reader);
#endif /* LIBXML_REGEXP_ENABLED */
    if ((reader->preserves > 0) &&
	(reader->node->extra & NODE_IS_SPRESERVED))
	reader->preserves--;
    reader->node = reader->node->parent;
    if ((reader->node == NULL) ||
	(reader->node->type == XML_DOCUMENT_NODE) ||
#ifdef LIBXML_DOCB_ENABLED
	(reader->node->type == XML_DOCB_DOCUMENT_NODE) ||
#endif
	(reader->node->type == XML_HTML_DOCUMENT_NODE)) {
	if (reader->mode != XML_TEXTREADER_MODE_EOF) {
	    val = xmlParseChunk(reader->ctxt, "", 0, 1);
	    reader->state = XML_TEXTREADER_DONE;
	    if (val != 0)
	        return(-1);
	}
	reader->node = NULL;
	reader->depth = -1;

	/*
	 * Cleanup of the old node
	 */
	if ((oldnode != NULL) && (reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (oldnode->type != XML_DTD_NODE) &&
	    ((oldnode->extra & NODE_IS_PRESERVED) == 0)) {
	    xmlUnlinkNode(oldnode);
	    xmlTextReaderFreeNode(reader, oldnode);
	}

	goto node_end;
    }
    if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
        (reader->in_xinclude == 0) &&
#endif
	(reader->entNr == 0) &&
        (reader->node->last != NULL) &&
        ((reader->node->last->extra & NODE_IS_PRESERVED) == 0)) {
	xmlNodePtr tmp = reader->node->last;
	xmlUnlinkNode(tmp);
	xmlTextReaderFreeNode(reader, tmp);
    }
    reader->depth--;
    reader->state = XML_TEXTREADER_BACKTRACK;

node_found:
    DUMP_READER

    /*
     * If we are in the middle of a piece of CDATA make sure it's finished
     */
    if ((reader->node != NULL) &&
        (reader->node->next == NULL) &&
        ((reader->node->type == XML_TEXT_NODE) ||
	 (reader->node->type == XML_CDATA_SECTION_NODE))) {
            if (xmlTextReaderExpand(reader) == NULL)
	        return -1;
    }

#ifdef LIBXML_XINCLUDE_ENABLED
    /*
     * Handle XInclude if asked for
     */
    if ((reader->xinclude) && (reader->in_xinclude == 0) &&
        (reader->node != NULL) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->ns != NULL) &&
	((xmlStrEqual(reader->node->ns->href, XINCLUDE_NS)) ||
	 (xmlStrEqual(reader->node->ns->href, XINCLUDE_OLD_NS)))) {
	if (reader->xincctxt == NULL) {
	    reader->xincctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
	    xmlXIncludeSetFlags(reader->xincctxt,
	                        reader->parserFlags & (~XML_PARSE_NOXINCNODE));
	}